

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QSslCertificate>::copyAppend
          (QGenericArrayOps<QSslCertificate> *this,QSslCertificate *b,QSslCertificate *e)

{
  qsizetype *pqVar1;
  QSslCertificate *pQVar2;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QSslCertificate>).ptr;
    do {
      QSslCertificate::QSslCertificate
                (pQVar2 + (this->super_QArrayDataPointer<QSslCertificate>).size,b);
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QSslCertificate>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }